

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton1.cpp
# Opt level: O0

void __thiscall SingleDataX::~SingleDataX(SingleDataX *this)

{
  ostream *poVar1;
  SingleData *pSVar2;
  void *this_00;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"SingleDataX::dtor: ");
  poVar1 = std::operator<<(poVar1,"SingleDataX::~SingleDataX()");
  poVar1 = std::operator<<(poVar1," ");
  pSVar2 = es::init::singleton<SingleData,_es::init::early_initializer,_void,_std::ios_base::Init>::
           instance();
  this_00 = (void *)std::ostream::operator<<(poVar1,pSVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

~SingleDataX()
    {
        std::cout << "SingleDataX::dtor: " << __PRETTY_FUNCTION__ << " "
                  << (void *)&es::init::singleton<SingleData>::instance() << std::endl;
    }